

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O0

SequenceRange
slang::ast::SequenceRange::fromSyntax
          (RangeSelectSyntax *syntax,ASTContext *context,bool allowUnbounded)

{
  SourceRange range_00;
  SourceRange range_01;
  SourceRange range_02;
  SourceRange sourceRange;
  bitmask<slang::ast::ASTFlags> extraFlags;
  optional<int> value;
  optional<int> value_00;
  bitmask<slang::ast::EvalFlags> extraFlags_00;
  bool bVar1;
  ExpressionSyntax *pEVar2;
  DiagCode extraout_var;
  int *piVar3;
  Diagnostic *this;
  byte in_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar4;
  Diagnostic *in_RSI;
  SequenceRange SVar5;
  Diagnostic *diag;
  optional<int> r;
  Expression *re;
  bitmask<slang::ast::ASTFlags> flags;
  optional<int> l;
  SequenceRange range;
  uint *in_stack_fffffffffffffeb8;
  optional<unsigned_int> *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffecc;
  int iVar7;
  SourceLocation in_stack_fffffffffffffed0;
  ASTContext *in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  _Storage<int,_true> in_stack_fffffffffffffeec;
  _Storage<int,_true> _Var8;
  undefined4 in_stack_fffffffffffffef0;
  Diagnostic *this_00;
  undefined8 local_a0;
  bitmask<slang::ast::EvalFlags> local_79;
  _Optional_payload_base<int> local_78;
  underlying_type local_70;
  int local_68;
  DiagCode DStack_64;
  bitmask<slang::ast::ASTFlags> local_60;
  bitmask<slang::ast::ASTFlags> local_58;
  SourceRange local_50;
  _Optional_payload_base<int> local_40;
  bitmask<slang::ast::ASTFlags> in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  _Storage<int,_true> _Var9;
  int local_c;
  undefined4 uStack_8;
  undefined1 local_4;
  
  extraFlags_00.m_bits = in_DL & 1;
  SequenceRange((SequenceRange *)0xec65cf);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec65ed);
  bitmask<slang::ast::ASTFlags>::bitmask
            ((bitmask<slang::ast::ASTFlags> *)&stack0xffffffffffffffc8,AssertionDelayOrRepetition);
  extraFlags.m_bits._4_4_ = in_stack_fffffffffffffeec._M_value;
  extraFlags.m_bits._0_4_ = in_stack_fffffffffffffee8;
  local_40 = (_Optional_payload_base<int>)
             ASTContext::evalInteger
                       ((ASTContext *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0),
                        (ExpressionSyntax *)in_stack_fffffffffffffed8,extraFlags);
  _Var9 = local_40._M_payload;
  this_00 = in_RSI;
  not_null<slang::syntax::ExpressionSyntax_*>::operator->
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec6651);
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
  value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>._4_4_ =
       in_stack_fffffffffffffef0;
  value.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
  _M_payload._M_value = in_stack_fffffffffffffeec._M_value;
  range_01.endLoc._0_4_ = in_stack_fffffffffffffee0;
  range_01.startLoc = (SourceLocation)in_stack_fffffffffffffed8;
  range_01.endLoc._4_4_ = in_stack_fffffffffffffee4;
  bVar1 = ASTContext::requirePositive((ASTContext *)in_stack_fffffffffffffed0,value,range_01);
  if (bVar1) {
    piVar3 = std::optional<int>::operator*((optional<int> *)0xec669e);
    local_c = *piVar3;
  }
  local_58 = ast::operator|(CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                            (ASTFlags)in_stack_fffffffffffffec0);
  if ((extraFlags_00.m_bits & 1) != 0) {
    bitmask<slang::ast::ASTFlags>::bitmask(&local_60,AllowUnboundedLiteral);
    bitmask<slang::ast::ASTFlags>::operator|=(&local_58,&local_60);
  }
  pEVar2 = not_null<slang::syntax::ExpressionSyntax_*>::operator*
                     ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec6700);
  local_70 = local_58.m_bits;
  local_68 = Expression::bind((int)pEVar2,(sockaddr *)in_RSI,(socklen_t)local_58.m_bits);
  DStack_64 = extraout_var;
  not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0xec6741);
  bVar1 = Type::isUnbounded((Type *)0xec6749);
  uVar4 = extraout_RDX;
  if (!bVar1) {
    uVar6 = SUB84(in_RSI,0);
    _Var8._M_value = (int)((ulong)in_RSI >> 0x20);
    iVar7 = local_68;
    memset(&local_79,0,1);
    bitmask<slang::ast::EvalFlags>::bitmask(&local_79);
    local_78 = (_Optional_payload_base<int>)
               ASTContext::evalInteger
                         ((ASTContext *)CONCAT44(_Var9._M_value,in_stack_ffffffffffffffd0),
                          (Expression *)in_stack_ffffffffffffffc8.m_bits,extraFlags_00);
    not_null<slang::syntax::ExpressionSyntax_*>::operator->
              ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec67dc);
    slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
    value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _4_4_ = iVar7;
    value_00.super__Optional_base<int,_true,_true>._M_payload.super__Optional_payload_base<int>.
    _M_payload._M_value = _Var8._M_value;
    range_02.endLoc._0_4_ = in_stack_fffffffffffffee0;
    range_02.startLoc = (SourceLocation)in_stack_fffffffffffffed8;
    range_02.endLoc._4_4_ = in_stack_fffffffffffffee4;
    bVar1 = ASTContext::requirePositive((ASTContext *)in_stack_fffffffffffffed0,value_00,range_02);
    uVar4 = extraout_RDX_00;
    if (bVar1) {
      std::optional<int>::operator*((optional<int> *)0xec682c);
      std::optional<unsigned_int>::optional<unsigned_int,_true>
                (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      uStack_8 = (undefined4)local_a0;
      local_4 = (undefined1)((ulong)local_a0 >> 0x20);
      piVar3 = std::optional<int>::operator*((optional<int> *)0xec6867);
      iVar7 = *piVar3;
      piVar3 = std::optional<int>::operator*((optional<int> *)0xec687a);
      uVar4 = extraout_RDX_01;
      if (*piVar3 < iVar7) {
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec68b4);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        sourceRange.startLoc._4_4_ = iVar7;
        sourceRange.startLoc._0_4_ = in_stack_fffffffffffffee0;
        sourceRange.endLoc._0_4_ = uVar6;
        sourceRange.endLoc._4_4_ = _Var8._M_value;
        this = ASTContext::addDiag(in_stack_fffffffffffffed8,DStack_64,sourceRange);
        uVar6 = SUB84(this,0);
        iVar7 = (int)((ulong)this >> 0x20);
        not_null<slang::syntax::ExpressionSyntax_*>::operator->
                  ((not_null<slang::syntax::ExpressionSyntax_*> *)0xec6913);
        slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
        range_00.startLoc._4_4_ = iVar7;
        range_00.startLoc._0_4_ = uVar6;
        range_00.endLoc = in_stack_fffffffffffffed0;
        Diagnostic::operator<<(in_RSI,range_00);
        std::optional<int>::operator*((optional<int> *)0xec6953);
        Diagnostic::operator<<<int>(this,iVar7);
        std::optional<int>::operator*((optional<int> *)0xec6971);
        Diagnostic::operator<<<int>(this,iVar7);
        uVar4 = extraout_RDX_02;
      }
    }
  }
  SVar5.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_payload = (_Storage<unsigned_int,_true>)uStack_8;
  SVar5.min = local_c;
  SVar5.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._4_4_ =
       (undefined4)CONCAT71((int7)((ulong)uVar4 >> 8),local_4);
  return SVar5;
}

Assistant:

SequenceRange SequenceRange::fromSyntax(const RangeSelectSyntax& syntax, const ASTContext& context,
                                        bool allowUnbounded) {
    SequenceRange range;
    auto l = context.evalInteger(*syntax.left, ASTFlags::AssertionDelayOrRepetition);
    if (context.requirePositive(l, syntax.left->sourceRange()))
        range.min = uint32_t(*l);

    // The rhs can be an unbounded '$' so we need extra AST flags.
    bitmask<ASTFlags> flags = ASTFlags::AssertionExpr | ASTFlags::AssertionDelayOrRepetition;
    if (allowUnbounded)
        flags |= ASTFlags::AllowUnboundedLiteral;

    auto& re = Expression::bind(*syntax.right, context, flags);
    if (re.type->isUnbounded())
        return range;

    auto r = context.evalInteger(re);
    if (context.requirePositive(r, syntax.right->sourceRange())) {
        range.max = uint32_t(*r);
        if (*l > *r) {
            auto& diag = context.addDiag(diag::SeqRangeMinMax, syntax.left->sourceRange());
            diag << syntax.right->sourceRange();
            diag << *l << *r;
        }
    }

    return range;
}